

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmBreak(LlvmCompilationContext *ctx,ExprBreak *node)

{
  LLVMValueRef pLVar1;
  
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::operator[]
            (&ctx->loopInfo,(ctx->loopInfo).count - *(int *)&(node->super_ExprBase).field_0x2c);
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmBreak(LlvmCompilationContext &ctx, ExprBreak *node)
{
	if(node->closures)
		CompileLlvm(ctx, node->closures);

	LLVMBasicBlockRef target = ctx.loopInfo[ctx.loopInfo.size() - node->depth].breakBlock;

	LLVMBuildBr(ctx.builder, target);

	LLVMBasicBlockRef afterReturn = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "after_break");

	LLVMPositionBuilderAtEnd(ctx.builder, afterReturn);

	return CheckType(ctx, node, NULL);
}